

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_prefix(FuncState *fs,UnOpr op,expdesc *e)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  long lVar5;
  OpCode op_00;
  expdesc e2;
  expdesc local_28;
  
  local_28.t = -1;
  local_28.f = -1;
  local_28.k = VKNUM;
  local_28.u.nval = 0.0;
  if (op == OPR_LEN) {
    luaK_exp2anyreg(fs,e);
    op_00 = OP_LEN;
  }
  else {
    if (op == OPR_NOT) {
      luaK_dischargevars(fs,e);
      switch(e->k) {
      case VNIL:
      case VFALSE:
        e->k = VTRUE;
        break;
      case VTRUE:
      case VK:
      case VKNUM:
        e->k = VFALSE;
        break;
      case VJMP:
        lVar5 = (long)(e->u).s.info;
        puVar4 = fs->f->code + lVar5;
        if ((0 < lVar5) && ((char)luaP_opmodes[puVar4[-1] & 0x3f] < '\0')) {
          puVar4 = puVar4 + -1;
        }
        *puVar4 = (uint)((*puVar4 & 0x3fc0) == 0) << 6 | *puVar4 & 0xffffc03f;
        break;
      case VRELOCABLE:
      case VNONRELOC:
        discharge2anyreg(fs,e);
        if (((e->k == VNONRELOC) && (uVar1 = (e->u).s.info, (uVar1 >> 8 & 1) == 0)) &&
           ((int)(uint)fs->nactvar <= (int)uVar1)) {
          fs->freereg = fs->freereg + -1;
        }
        iVar3 = luaK_code(fs,(e->u).s.info << 0x17 | 0x13,fs->ls->lastline);
        (e->u).s.info = iVar3;
        e->k = VRELOCABLE;
      }
      iVar3 = e->t;
      iVar2 = e->f;
      e->f = iVar3;
      e->t = iVar2;
      removevalues(fs,iVar3);
      removevalues(fs,e->t);
      return;
    }
    if (op != OPR_MINUS) {
      return;
    }
    if (((e->k != VKNUM) || (e->t != -1)) || (e->f != -1)) {
      luaK_exp2anyreg(fs,e);
    }
    op_00 = OP_UNM;
  }
  codearith(fs,op_00,e,&local_28);
  return;
}

Assistant:

void luaK_prefix (FuncState *fs, UnOpr op, expdesc *e) {
  expdesc e2;
  e2.t = e2.f = NO_JUMP; e2.k = VKNUM; e2.u.nval = 0;
  switch (op) {
    case OPR_MINUS: {
      if (!isnumeral(e))
        luaK_exp2anyreg(fs, e);  /* cannot operate on non-numeric constants */
      codearith(fs, OP_UNM, e, &e2);
      break;
    }
    case OPR_NOT: codenot(fs, e); break;
    case OPR_LEN: {
      luaK_exp2anyreg(fs, e);  /* cannot operate on constants */
      codearith(fs, OP_LEN, e, &e2);
      break;
    }
    default: lua_assert(0);
  }
}